

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O2

void anon_unknown.dwarf_17f5f3::ReverbState::DoMixRow
               (span<float,_18446744073709551615UL> OutBuffer,
               span<const_float,_18446744073709551615UL> Gains,float *InSamples,size_t InStride)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  
  pfVar4 = Gains.mData;
  for (pfVar2 = OutBuffer.mData; pfVar2 != OutBuffer.mDataEnd; pfVar2 = pfVar2 + 1) {
    *pfVar2 = 0.0;
  }
  for (; pfVar4 != Gains.mDataEnd; pfVar4 = pfVar4 + 1) {
    fVar1 = *pfVar4;
    if (1e-05 < ABS(fVar1)) {
      for (lVar3 = 0; pfVar2 = (float *)((long)OutBuffer.mData + lVar3),
          pfVar2 != OutBuffer.mDataEnd; lVar3 = lVar3 + 4) {
        *pfVar2 = *(float *)((long)InSamples + lVar3) * fVar1 + *pfVar2;
      }
    }
    InSamples = InSamples + InStride;
  }
  return;
}

Assistant:

static void DoMixRow(const al::span<float> OutBuffer, const al::span<const float> Gains,
        const float *InSamples, const size_t InStride)
    {
        std::fill(OutBuffer.begin(), OutBuffer.end(), 0.0f);
        for(const float gain : Gains)
        {
            const float *RESTRICT input{al::assume_aligned<16>(InSamples)};
            InSamples += InStride;

            if(!(std::fabs(gain) > GainSilenceThreshold))
                continue;

            for(float &sample : OutBuffer)
            {
                sample += *input * gain;
                ++input;
            }
        }
    }